

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O0

int pkey_ec_sign(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_44;
  EC_KEY *pEStack_40;
  uint sltmp;
  EC_KEY *ec;
  size_t tbslen_local;
  uint8_t *tbs_local;
  size_t *siglen_local;
  uint8_t *sig_local;
  EVP_PKEY_CTX *ctx_local;
  
  pEStack_40 = (EC_KEY *)ctx->pkey->pkey;
  ec = (EC_KEY *)tbslen;
  tbslen_local = (size_t)tbs;
  tbs_local = (uint8_t *)siglen;
  siglen_local = (size_t *)sig;
  sig_local = (uint8_t *)ctx;
  if (sig == (uint8_t *)0x0) {
    iVar2 = ECDSA_size(pEStack_40);
    *(ulong *)tbs_local = CONCAT44(extraout_var,iVar2);
    ctx_local._4_4_ = 1;
  }
  else {
    uVar1 = *siglen;
    iVar2 = ECDSA_size(pEStack_40);
    if (uVar1 < CONCAT44(extraout_var_00,iVar2)) {
      ERR_put_error(6,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                    ,0x50);
      ctx_local._4_4_ = 0;
    }
    else {
      iVar2 = ECDSA_sign(0,(uchar *)tbslen_local,(int)ec,(uchar *)siglen_local,&local_44,pEStack_40)
      ;
      if (iVar2 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        *(ulong *)tbs_local = (ulong)local_44;
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_ec_sign(EVP_PKEY_CTX *ctx, uint8_t *sig, size_t *siglen,
                        const uint8_t *tbs, size_t tbslen) {
  const EC_KEY *ec = reinterpret_cast<EC_KEY *>(ctx->pkey->pkey);
  if (!sig) {
    *siglen = ECDSA_size(ec);
    return 1;
  } else if (*siglen < (size_t)ECDSA_size(ec)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  unsigned int sltmp;
  if (!ECDSA_sign(0, tbs, tbslen, sig, &sltmp, ec)) {
    return 0;
  }
  *siglen = (size_t)sltmp;
  return 1;
}